

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerMSL::declare_undefined_values(CompilerMSL *this)

{
  anon_class_16_2_6cfede0d local_28;
  bool local_11;
  CompilerMSL *pCStack_10;
  bool emitted;
  CompilerMSL *this_local;
  
  local_11 = false;
  local_28.emitted = &local_11;
  local_28.this = this;
  pCStack_10 = this;
  ParsedIR::
  for_each_typed_id<spirv_cross::SPIRUndef,spirv_cross::CompilerMSL::declare_undefined_values()::__0>
            (&(this->super_CompilerGLSL).super_Compiler.ir,&local_28);
  if ((local_11 & 1U) != 0) {
    CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x4d8596);
  }
  return;
}

Assistant:

void CompilerMSL::declare_undefined_values()
{
	bool emitted = false;
	ir.for_each_typed_id<SPIRUndef>([&](uint32_t, SPIRUndef &undef) {
		auto &type = this->get<SPIRType>(undef.basetype);
		// OpUndef can be void for some reason ...
		if (type.basetype == SPIRType::Void)
			return;

		statement("constant ", variable_decl(type, to_name(undef.self), undef.self), " = {};");
		emitted = true;
	});

	if (emitted)
		statement("");
}